

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     IntersectFrames<duckdb::WindowQuantileState<duckdb::interval_t>::SkipListUpdater>
               (SubFrames *lefts,SubFrames *rights,SkipListUpdater *op)

{
  const_reference pvVar1;
  size_type sVar2;
  SkipListUpdater *this;
  SkipListUpdater *begin;
  CursorType *this_00;
  SkipListUpdater *in_RDX;
  vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_> *in_RSI;
  vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_> *in_RDI;
  unsigned_long limit;
  FrameBounds *right;
  FrameBounds *left;
  uint8_t overlap;
  unsigned_long i;
  idx_t r;
  idx_t l;
  FrameBounds last;
  unsigned_long cover_end;
  unsigned_long cover_start;
  ulong in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  bool local_89;
  idx_t a;
  idx_t a_00;
  vector<duckdb::FrameBounds,_true> *in_stack_ffffffffffffffa0;
  bool local_51;
  CursorType *local_50;
  ulong local_48;
  ulong local_40;
  SkipListUpdater local_38;
  CursorType *local_20;
  SkipListUpdater *local_18;
  vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_> *local_10;
  vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_> *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  pvVar1 = vector<duckdb::FrameBounds,_true>::operator[]
                     ((vector<duckdb::FrameBounds,_true> *)
                      CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                      in_stack_ffffffffffffff58);
  a = pvVar1->start;
  pvVar1 = vector<duckdb::FrameBounds,_true>::operator[]
                     ((vector<duckdb::FrameBounds,_true> *)
                      CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                      in_stack_ffffffffffffff58);
  local_20 = (CursorType *)MinValue<unsigned_long>(a,pvVar1->start);
  pvVar1 = vector<duckdb::FrameBounds,_true>::back(in_stack_ffffffffffffffa0);
  a_00 = pvVar1->end;
  pvVar1 = vector<duckdb::FrameBounds,_true>::back(in_stack_ffffffffffffffa0);
  local_38.included = (IncludedType *)MaxValue<unsigned_long>(a_00,pvVar1->end);
  FrameBounds::FrameBounds
            ((FrameBounds *)&local_38,(idx_t)local_38.included,(idx_t)local_38.included);
  local_40 = 0;
  local_48 = 0;
  local_50 = local_20;
  do {
    if (local_38.included <= local_50) {
      return;
    }
    local_51 = false;
    this = &local_38;
    sVar2 = std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>::size(local_8);
    if (local_40 < sVar2) {
      this = (SkipListUpdater *)
             vector<duckdb::FrameBounds,_true>::operator[]
                       ((vector<duckdb::FrameBounds,_true> *)
                        CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                        in_stack_ffffffffffffff58);
      local_89 = false;
      if ((CursorType *)this->skip <= local_50) {
        local_89 = local_50 < this->data;
      }
      local_51 = local_89;
    }
    begin = &local_38;
    sVar2 = std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>::size(local_10);
    if (local_48 < sVar2) {
      begin = (SkipListUpdater *)
              vector<duckdb::FrameBounds,_true>::operator[]
                        ((vector<duckdb::FrameBounds,_true> *)
                         CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                         in_stack_ffffffffffffff58);
      in_stack_ffffffffffffff67 = false;
      if ((CursorType *)begin->skip <= local_50) {
        in_stack_ffffffffffffff67 = local_50 < begin->data;
      }
      local_51 = (bool)(local_51 | in_stack_ffffffffffffff67 << 1);
    }
    in_stack_ffffffffffffff58 = (ulong)local_51;
    switch(in_stack_ffffffffffffff58) {
    case 0:
      this_00 = (CursorType *)
                MinValue<unsigned_long>((unsigned_long)begin->skip,(unsigned_long)this->skip);
      WindowQuantileState<duckdb::interval_t>::SkipListUpdater::Neither
                (local_18,(idx_t)local_50,(idx_t)this_00);
      break;
    case 1:
      this_00 = (CursorType *)
                MinValue<unsigned_long>((unsigned_long)this->data,(unsigned_long)begin->skip);
      WindowQuantileState<duckdb::interval_t>::SkipListUpdater::Left
                (this,(idx_t)begin,(idx_t)this_00);
      break;
    case 2:
      this_00 = (CursorType *)
                MinValue<unsigned_long>((unsigned_long)begin->data,(unsigned_long)this->skip);
      WindowQuantileState<duckdb::interval_t>::SkipListUpdater::Right
                ((SkipListUpdater *)this_00,a_00,a);
      break;
    case 3:
    default:
      this_00 = (CursorType *)
                MinValue<unsigned_long>((unsigned_long)begin->data,(unsigned_long)this->data);
      WindowQuantileState<duckdb::interval_t>::SkipListUpdater::Both
                (local_18,(idx_t)local_50,(idx_t)this_00);
    }
    local_40 = (this_00 == this->data) + local_40;
    local_48 = (this_00 == begin->data) + local_48;
    local_50 = this_00;
  } while( true );
}

Assistant:

static void IntersectFrames(const SubFrames &lefts, const SubFrames &rights, OP &op) {
		const auto cover_start = MinValue(rights[0].start, lefts[0].start);
		const auto cover_end = MaxValue(rights.back().end, lefts.back().end);
		const FrameBounds last(cover_end, cover_end);

		//	Subframe indices
		idx_t l = 0;
		idx_t r = 0;
		for (auto i = cover_start; i < cover_end;) {
			uint8_t overlap = 0;

			// Are we in the previous frame?
			auto left = &last;
			if (l < lefts.size()) {
				left = &lefts[l];
				overlap |= uint8_t(left->start <= i && i < left->end) << 0;
			}

			// Are we in the current frame?
			auto right = &last;
			if (r < rights.size()) {
				right = &rights[r];
				overlap |= uint8_t(right->start <= i && i < right->end) << 1;
			}

			auto limit = i;
			switch (overlap) {
			case 0x00:
				// i ∉ F U P
				limit = MinValue(right->start, left->start);
				op.Neither(i, limit);
				break;
			case 0x01:
				// i ∈ P \ F
				limit = MinValue(left->end, right->start);
				op.Left(i, limit);
				break;
			case 0x02:
				// i ∈ F \ P
				limit = MinValue(right->end, left->start);
				op.Right(i, limit);
				break;
			case 0x03:
			default:
				D_ASSERT(overlap == 0x03);
				// i ∈ F ∩ P
				limit = MinValue(right->end, left->end);
				op.Both(i, limit);
				break;
			}

			// Advance  the subframe indices
			i = limit;
			l += (i == left->end);
			r += (i == right->end);
		}
	}